

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O0

void av1_invalid_rd_stats(RD_STATS *rd_stats)

{
  RD_STATS *rd_stats_local;
  
  rd_stats->rate = 0x7fffffff;
  rd_stats->dist = 0x7fffffffffffffff;
  rd_stats->rdcost = 0x7fffffffffffffff;
  rd_stats->sse = 0x7fffffffffffffff;
  rd_stats->skip_txfm = '\0';
  rd_stats->zero_rate = 0;
  return;
}

Assistant:

static inline void av1_invalid_rd_stats(RD_STATS *rd_stats) {
#if CONFIG_RD_DEBUG
  int plane;
#endif
  rd_stats->rate = INT_MAX;
  rd_stats->dist = INT64_MAX;
  rd_stats->rdcost = INT64_MAX;
  rd_stats->sse = INT64_MAX;
  rd_stats->skip_txfm = 0;
  rd_stats->zero_rate = 0;
#if CONFIG_RD_DEBUG
  // This may run into problems when monochrome video is
  // encoded, as there will only be 1 plane
  for (plane = 0; plane < MAX_MB_PLANE; ++plane) {
    rd_stats->txb_coeff_cost[plane] = INT_MAX;
  }
#endif
}